

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateModuleTypePrototypes(ExpressionTranslateContext *ctx)

{
  ExpressionContext *pEVar1;
  ulong uVar2;
  TypeBase *pTVar3;
  TypeBase *type;
  
  PrintIndentedLine(ctx,"// Type prototypes");
  pEVar1 = ctx->ctx;
  if ((pEVar1->types).count != 0) {
    uVar2 = 0;
    do {
      pTVar3 = (pEVar1->types).data[uVar2];
      if (pTVar3->isGeneric == false) {
        if (((pTVar3 == (TypeBase *)0x0) || (0x19 < pTVar3->typeID)) ||
           (type = pTVar3, (0x3130000U >> (pTVar3->typeID & 0x1f) & 1) == 0)) {
          type = (TypeBase *)0x0;
        }
        if (type == (TypeBase *)0x0) {
          if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x13)) {
            pTVar3 = (TypeBase *)0x0;
          }
          if (pTVar3 != (TypeBase *)0x0) {
            Print(ctx,"struct ");
            PrintEscapedName(ctx,pTVar3->name);
            goto LAB_001481f5;
          }
        }
        else {
          if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x18)) {
            pTVar3 = (TypeBase *)0x0;
          }
          if (((pTVar3 == (TypeBase *)0x0) || (pTVar3->importModule == (ModuleData *)0x0)) ||
             (*(char *)((long)&pTVar3[3]._vptr_TypeBase + 1) == '\0')) {
            Print(ctx,"struct ");
            PrintEscapedTypeName(ctx,type);
LAB_001481f5:
            Print(ctx,";");
            OutputContext::Print(ctx->output,"\n",1);
          }
        }
      }
      uVar2 = uVar2 + 1;
      pEVar1 = ctx->ctx;
    } while (uVar2 < (pEVar1->types).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleTypePrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Type prototypes");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->importModule && typeClass->isInternal)
					continue;
			}

			Print(ctx, "struct ");
			PrintEscapedTypeName(ctx, typeStruct);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "struct ");
			PrintEscapedName(ctx, typeArray->name);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}